

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O0

void icetDataReplicationGroupColor(IceTInt color)

{
  int local_2c;
  int local_28;
  IceTInt size;
  IceTInt i;
  IceTInt num_proc;
  IceTInt *mygroup;
  IceTInt *allcolors;
  IceTInt color_local;
  
  allcolors._4_4_ = color;
  icetGetIntegerv(3,&size);
  mygroup = (IceTInt *)icetGetStateBuffer(0x1a0,size << 2);
  _i = (IceTInt *)icetGetStateBuffer(0x1a1,size << 2);
  icetCommAllgather((void *)((long)&allcolors + 4),1,0x8003,mygroup);
  local_2c = 0;
  for (local_28 = 0; local_28 < size; local_28 = local_28 + 1) {
    if (mygroup[local_28] == allcolors._4_4_) {
      _i[local_2c] = local_28;
      local_2c = local_2c + 1;
    }
  }
  icetDataReplicationGroup(local_2c,_i);
  return;
}

Assistant:

void icetDataReplicationGroupColor(IceTInt color)
{
    IceTInt *allcolors;
    IceTInt *mygroup;
    IceTInt num_proc;
    IceTInt i;
    IceTInt size;

    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);

    /* Just grab two buffers that should be not be used now.  We will be
       done with them by the time we return from this function. */
    allcolors = icetGetStateBuffer(ICET_STRATEGY_BUFFER_0,
                                   sizeof(IceTInt)*num_proc);
    mygroup = icetGetStateBuffer(ICET_STRATEGY_BUFFER_1,
                                 sizeof(IceTInt)*num_proc);

    icetCommAllgather(&color, 1, ICET_INT, allcolors);

    size = 0;
    for (i = 0; i < num_proc; i++) {
        if (allcolors[i] == color) {
            mygroup[size] = i;
            size++;
        }
    }

    icetDataReplicationGroup(size, mygroup);
}